

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O1

void * __thiscall mpt::buffer::append(buffer *this,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  void *pvVar3;
  
  uVar1 = this->_used;
  if (this->_size - uVar1 < len) {
    pvVar3 = (void *)0x0;
  }
  else {
    if (this->_content_traits != (type_traits *)0x0) {
      uVar2 = this->_content_traits->size;
      if (uVar2 == 0) {
        return (void *)0x0;
      }
      if (uVar1 % uVar2 != 0) {
        return (void *)0x0;
      }
      if (len % uVar2 != 0) {
        return (void *)0x0;
      }
    }
    pvVar3 = (void *)((long)&this[1]._vptr_buffer + uVar1);
    this->_used = len + uVar1;
  }
  return pvVar3;
}

Assistant:

void *buffer::append(size_t len)
{
	size_t used = _used;
	size_t avail = _size - used;
	if (len > avail) {
		return 0;
	}
	uint8_t *base = static_cast<uint8_t *>(static_cast<void *>(this + 1)) + used;
	const struct type_traits *traits;
	if ((traits = content_traits())) {
		size_t size;
		if (!(size = traits->size)
		 || used % size
		 || len % size) {
			return 0;
		}
	}
	_used += len;
	return base;
}